

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cc
# Opt level: O1

int main(int param_1,char **param_2)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  FILE *__stream;
  void *__buf;
  uchar *in_RCX;
  FILE *__n;
  size_t n;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t n_00;
  int iVar4;
  int __fd;
  uchar *d_00;
  MD5 b;
  MD5 a;
  Pl_MD5 p;
  uchar buf [50];
  Pl_Discard d;
  Pl_MD5 p2;
  string local_178;
  MD5 local_158;
  MD5 local_148;
  undefined1 local_138 [80];
  string local_e8;
  Pipeline local_b0;
  Pl_MD5 local_80;
  
  test_string("");
  test_string("a");
  test_string("abc");
  test_string("message digest");
  test_string("abcdefghijklmnopqrstuvwxyz");
  test_string("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789");
  test_string("12345678901234567890123456789012345678901234567890123456789012345678901234567890");
  MD5::MD5(&local_148,(uchar *)param_2,n,in_RCX);
  MD5::encodeFile(&local_148,"md5.in",-1);
  MD5::unparse_abi_cxx11_((string *)local_138,&local_148);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_138._0_8_,local_138._8_8_);
  cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  d_00 = (uchar *)(ulong)(uint)(int)cVar1;
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  n_00 = extraout_RDX;
  if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
    d_00 = (uchar *)(local_138._16_8_ + 1);
    operator_delete((void *)local_138._0_8_,(ulong)d_00);
    n_00 = extraout_RDX_00;
  }
  MD5::MD5(&local_158,d_00,n_00,in_RCX);
  MD5::encodeFile(&local_158,"md5.in",100);
  MD5::unparse_abi_cxx11_((string *)local_138,&local_158);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_138._0_8_,local_138._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
  }
  MD5::checkDataChecksum((MD5 *)"900150983cd24fb0d6963f7d28e17f72","abc",(char *)0x3,(size_t)in_RCX)
  ;
  poVar3 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  bVar2 = (bool)std::ostream::flush();
  MD5::checkFileChecksum
            ((MD5 *)"5f4b4321873433daae578f85c72f9e74","md5.in",(char *)0xffffffffffffffff,
             (qpdf_offset_t)in_RCX);
  poVar3 = std::ostream::_M_insert<bool>(bVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  bVar2 = (bool)std::ostream::flush();
  MD5::checkFileChecksum
            ((MD5 *)"6f4b4321873433daae578f85c72f9e74","md5.in",(char *)0xffffffffffffffff,
             (qpdf_offset_t)in_RCX);
  poVar3 = std::ostream::_M_insert<bool>(bVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  bVar2 = (bool)std::ostream::flush();
  MD5::checkDataChecksum((MD5 *)"000150983cd24fb0d6963f7d28e17f72","abc",(char *)0x3,(size_t)in_RCX)
  ;
  poVar3 = std::ostream::_M_insert<bool>(bVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  bVar2 = (bool)std::ostream::flush();
  MD5::checkFileChecksum
            ((MD5 *)"6f4b4321873433daae578f85c72f9e74","glerbl",(char *)0xffffffffffffffff,
             (qpdf_offset_t)in_RCX);
  poVar3 = std::ostream::_M_insert<bool>(bVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  Pl_Discard::Pl_Discard((Pl_Discard *)&local_b0);
  Pl_MD5::Pl_MD5((Pl_MD5 *)local_138,"MD5",&local_b0);
  Pl_MD5::Pl_MD5(&local_80,"MD5",&local_b0);
  Pl_MD5::persistAcrossFinish(&local_80,true);
  iVar4 = 0;
  do {
    __stream = (FILE *)QUtil::safe_fopen("md5.in","rb");
    bVar2 = false;
    do {
      __n = __stream;
      __buf = (void *)fread(&local_e8,1,0x32,__stream);
      if (__buf == (void *)0x0) {
        bVar2 = true;
      }
      else {
        __fd = (int)&local_e8;
        Pl_MD5::write((Pl_MD5 *)local_138,__fd,__buf,(size_t)__n);
        Pl_MD5::write(&local_80,__fd,__buf,(size_t)__n);
        if (iVar4 == 1) {
          Pl_MD5::getHexDigest_abi_cxx11_(&local_178,(Pl_MD5 *)local_138);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_178._M_dataplus._M_p,
                              local_178._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
          }
        }
      }
    } while (!bVar2);
    fclose(__stream);
    Pl_MD5::finish((Pl_MD5 *)local_138);
    Pl_MD5::finish(&local_80);
    Pl_MD5::getHexDigest_abi_cxx11_(&local_178,(Pl_MD5 *)local_138);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_178._M_dataplus._M_p,local_178._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
    Pl_MD5::getHexDigest_abi_cxx11_(&local_178,(Pl_MD5 *)local_138);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_178._M_dataplus._M_p,local_178._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
    bVar2 = iVar4 == 0;
    iVar4 = iVar4 + 1;
  } while (bVar2);
  Pl_MD5::getHexDigest_abi_cxx11_(&local_e8,&local_80);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_e8._M_dataplus._M_p,local_e8._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  Pl_MD5::~Pl_MD5(&local_80);
  Pl_MD5::~Pl_MD5((Pl_MD5 *)local_138);
  Pl_Discard::~Pl_Discard((Pl_Discard *)&local_b0);
  if (local_158.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_148.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return 0;
}

Assistant:

int
main(int, char*[])
{
    test_string("");
    test_string("a");
    test_string("abc");
    test_string("message digest");
    test_string("abcdefghijklmnopqrstuvwxyz");
    test_string(
        "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghi"
        "jklmnopqrstuvwxyz0123456789");
    test_string(
        "1234567890123456789012345678901234567890"
        "1234567890123456789012345678901234567890");
    MD5 a;
    a.encodeFile("md5.in");
    std::cout << a.unparse() << std::endl;
    MD5 b;
    b.encodeFile("md5.in", 100);
    std::cout << b.unparse() << std::endl;

    std::cout << MD5::checkDataChecksum("900150983cd24fb0d6963f7d28e17f72", "abc", 3) << std::endl
              << MD5::checkFileChecksum("5f4b4321873433daae578f85c72f9e74", "md5.in") << std::endl
              << MD5::checkFileChecksum("6f4b4321873433daae578f85c72f9e74", "md5.in") << std::endl
              << MD5::checkDataChecksum("000150983cd24fb0d6963f7d28e17f72", "abc", 3) << std::endl
              << MD5::checkFileChecksum("6f4b4321873433daae578f85c72f9e74", "glerbl") << std::endl;

    Pl_Discard d;
    Pl_MD5 p("MD5", &d);
    // Create a second pipeline, protect against finish, and call
    // getHexDigest only once at the end of both passes. Make sure the
    // checksum is that of the input file concatenated to itself. This
    // will require changes to Pl_MD5.cc to prevent finish from
    // calling finalize.
    Pl_MD5 p2("MD5", &d);
    p2.persistAcrossFinish(true);
    for (int i = 0; i < 2; ++i) {
        FILE* f = QUtil::safe_fopen("md5.in", "rb");
        // buffer size < size of md5.in
        unsigned char buf[50];
        bool done = false;
        while (!done) {
            size_t len = fread(buf, 1, sizeof(buf), f);
            if (len <= 0) {
                done = true;
            } else {
                p.write(buf, len);
                p2.write(buf, len);
                if (i == 1) {
                    // Partial digest -- resets after each call to write
                    std::cout << p.getHexDigest() << std::endl;
                }
            }
        }
        fclose(f);
        p.finish();
        p2.finish();
        // Make sure calling getHexDigest twice with no intervening
        // writes results in the same result each time.
        std::cout << p.getHexDigest() << std::endl;
        std::cout << p.getHexDigest() << std::endl;
    }
    std::cout << p2.getHexDigest() << std::endl;

    return 0;
}